

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::find<long>(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
             *this,key_arg<long> *key)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  ctrl_t *pcVar4;
  anon_union_8_1_a8a14541_for_iterator_1 in_RDX;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  __m128i match;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  iterator iVar10;
  anon_union_8_1_a8a14541_for_iterator_1 local_30;
  ulong local_28;
  long local_20;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    pcVar4 = (ctrl_t *)0x0;
    local_30 = in_RDX;
  }
  else {
    probe((probe_seq<16UL> *)&local_30,this,0);
    pcVar4 = this->ctrl_;
    while( true ) {
      pcVar1 = pcVar4 + local_28;
      cVar3 = pcVar1[0xf];
      auVar9[0] = -(*pcVar1 == '\0');
      auVar9[1] = -(pcVar1[1] == '\0');
      auVar9[2] = -(pcVar1[2] == '\0');
      auVar9[3] = -(pcVar1[3] == '\0');
      auVar9[4] = -(pcVar1[4] == '\0');
      auVar9[5] = -(pcVar1[5] == '\0');
      auVar9[6] = -(pcVar1[6] == '\0');
      auVar9[7] = -(pcVar1[7] == '\0');
      auVar9[8] = -(pcVar1[8] == '\0');
      auVar9[9] = -(pcVar1[9] == '\0');
      auVar9[10] = -(pcVar1[10] == '\0');
      auVar9[0xb] = -(pcVar1[0xb] == '\0');
      auVar9[0xc] = -(pcVar1[0xc] == '\0');
      auVar9[0xd] = -(pcVar1[0xd] == '\0');
      auVar9[0xe] = -(pcVar1[0xe] == '\0');
      auVar9[0xf] = -(cVar3 == '\0');
      for (uVar6 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar9[0xf] >> 7) << 0xf); uVar6 != 0;
          uVar6 = uVar6 - 1 & uVar6) {
        uVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar7 = uVar2 + local_28 & (ulong)local_30.slot_;
        if ((int)this->slots_[uVar7] == (int)*key) {
          local_30.slot_ = this->slots_ + uVar7;
          pcVar4 = pcVar4 + uVar7;
          goto LAB_0011d372;
        }
      }
      auVar8[0] = -(*pcVar1 == -0x80);
      auVar8[1] = -(pcVar1[1] == -0x80);
      auVar8[2] = -(pcVar1[2] == -0x80);
      auVar8[3] = -(pcVar1[3] == -0x80);
      auVar8[4] = -(pcVar1[4] == -0x80);
      auVar8[5] = -(pcVar1[5] == -0x80);
      auVar8[6] = -(pcVar1[6] == -0x80);
      auVar8[7] = -(pcVar1[7] == -0x80);
      auVar8[8] = -(pcVar1[8] == -0x80);
      auVar8[9] = -(pcVar1[9] == -0x80);
      auVar8[10] = -(pcVar1[10] == -0x80);
      auVar8[0xb] = -(pcVar1[0xb] == -0x80);
      auVar8[0xc] = -(pcVar1[0xc] == -0x80);
      auVar8[0xd] = -(pcVar1[0xd] == -0x80);
      auVar8[0xe] = -(pcVar1[0xe] == -0x80);
      auVar8[0xf] = -(cVar3 == -0x80);
      if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80)
      break;
      lVar5 = local_28 + local_20;
      local_20 = local_20 + 0x10;
      local_28 = lVar5 + 0x10U & (ulong)local_30.slot_;
    }
  }
  pcVar4 = pcVar4 + this->capacity_;
LAB_0011d372:
  iVar10.field_1.slot_ = local_30.slot_;
  iVar10.ctrl_ = pcVar4;
  return iVar10;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }